

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_ubatch * __thiscall llama_sbatch::split_seq(llama_sbatch *this,size_t n_ubatch)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *in_RDX;
  ulong *in_RSI;
  llama_ubatch *in_RDI;
  bool unaff_retaddr;
  size_t in_stack_00000008;
  llama_sbatch *in_stack_00000010;
  size_t length;
  llama_sbatch_seq *s;
  size_t in_stack_00000078;
  llama_sbatch_seq *in_stack_00000080;
  llama_ubatch *in_stack_00000088;
  llama_sbatch *in_stack_00000090;
  
  if ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)*in_RSI < in_RDX) {
    in_RDX = (vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)*in_RSI;
  }
  reserve_ubatch(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  bVar1 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::empty(in_RDX);
  if (!bVar1) {
    sVar2 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::size
                      ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)(in_RSI + 9));
    pvVar3 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                       ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)(in_RSI + 9),
                        sVar2 - 1);
    if (pvVar3->n_seq_id < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,0xba,"GGML_ASSERT(%s) failed","s.n_seq_id > 0");
    }
    add_seq_to_ubatch(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  }
  return in_RDI;
}

Assistant:

llama_ubatch llama_sbatch::split_seq(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    if (!seq.empty()) {
        llama_sbatch_seq & s = seq[seq.size() - 1];
        size_t length = s.length < n_ubatch ? s.length : n_ubatch;
        GGML_ASSERT(s.n_seq_id > 0); // should not be mixed with simple splits
        add_seq_to_ubatch(ubatch, s, length);
    }
    return ubatch;
}